

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::convert_to_string
          (spirv_cross *this,int64_t value,string *int64_type,bool long_long_literal_suffix)

{
  long lVar1;
  __cxx11 local_50 [32];
  char *local_30;
  byte local_21;
  string *psStack_20;
  bool long_long_literal_suffix_local;
  string *int64_type_local;
  int64_t value_local;
  
  local_21 = long_long_literal_suffix;
  psStack_20 = int64_type;
  int64_type_local = (string *)value;
  value_local = (int64_t)this;
  lVar1 = ::std::numeric_limits<long>::min();
  if (value == lVar1) {
    local_30 = "l";
    if ((local_21 & 1) != 0) {
      local_30 = "ll";
    }
    join<std::__cxx11::string_const&,char_const(&)[21],char_const*,char_const(&)[2]>
              (this,psStack_20,(char (*) [21])"(0x8000000000000000u",&local_30,
               (char (*) [2])0x5b48c4);
  }
  else {
    ::std::__cxx11::to_string(local_50,(long)int64_type_local);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  return this;
}

Assistant:

static inline std::string convert_to_string(int64_t value, const std::string &int64_type, bool long_long_literal_suffix)
{
	// INT64_MIN is ... special on some backends.
	// If we use a decimal literal, and negate it, we might overflow the representable numbers.
	// To workaround it, emit int(0x80000000) instead.
	if (value == std::numeric_limits<int64_t>::min())
		return join(int64_type, "(0x8000000000000000u", (long_long_literal_suffix ? "ll" : "l"), ")");
	else
		return std::to_string(value) + (long_long_literal_suffix ? "ll" : "l");
}